

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O3

UBool __thiscall icu_63::NFSubstitution::operator==(NFSubstitution *this,NFSubstitution *rhs)

{
  char *__s1;
  char *__s2;
  int iVar1;
  
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  __s2 = *(char **)((rhs->super_UObject)._vptr_UObject[-1] + 8);
  if ((((__s1 == __s2) || ((*__s1 != '*' && (iVar1 = strcmp(__s1,__s2), iVar1 == 0)))) &&
      (this->pos == rhs->pos)) &&
     ((this->ruleSet == (NFRuleSet *)0x0) != (rhs->ruleSet != (NFRuleSet *)0x0))) {
    if (this->numberFormat != (DecimalFormat *)0x0) {
      iVar1 = (*(this->numberFormat->super_NumberFormat).super_Format.super_UObject._vptr_UObject[3]
              )();
      return (char)iVar1 != '\0';
    }
    return rhs->numberFormat == (DecimalFormat *)0x0;
  }
  return '\0';
}

Assistant:

UBool
NFSubstitution::operator==(const NFSubstitution& rhs) const
{
  // compare class and all of the fields all substitutions have
  // in common
  // this should be called by subclasses before their own equality tests
  return typeid(*this) == typeid(rhs)
  && pos == rhs.pos
  && (ruleSet == NULL) == (rhs.ruleSet == NULL)
  // && ruleSet == rhs.ruleSet causes circularity, other checks to make instead?
  && (numberFormat == NULL
      ? (rhs.numberFormat == NULL)
      : (*numberFormat == *rhs.numberFormat));
}